

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_client.cpp
# Opt level: O0

void HaveATest(Socket *sock,InetAddress *serverAddr)

{
  bool bVar1;
  sz_sock sock_00;
  LogLevel LVar2;
  sockaddr *addr;
  size_t sVar3;
  LogStream *pLVar4;
  self *psVar5;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  SourceFile file_07;
  SourceFile file_08;
  SourceFile file_09;
  SourceFile file_10;
  SourceFile file_11;
  SourceFile file_12;
  SourceFile file_13;
  SourceFile file_14;
  SourceFile file_15;
  SourceFile file_16;
  SourceFile file_17;
  SourceFile file_18;
  SourceFile file_19;
  SourceFile file_20;
  SourceFile file_21;
  SourceFile file_22;
  undefined1 auStack_17d70 [12];
  Logger LStack_17d60;
  undefined1 auStack_16d90 [12];
  Logger LStack_16d80;
  undefined1 auStack_15db0 [12];
  Logger LStack_15da0;
  undefined1 auStack_14dd0 [12];
  Logger LStack_14dc0;
  undefined1 auStack_13df0 [12];
  Logger LStack_13de0;
  undefined1 auStack_12e10 [12];
  Logger LStack_12e00;
  undefined1 auStack_11e30 [12];
  Logger LStack_11e20;
  undefined1 auStack_10e50 [12];
  Logger LStack_10e40;
  undefined1 local_fe70 [12];
  Logger local_fe60;
  undefined1 local_ee90 [12];
  Logger local_ee80;
  undefined1 local_deb0 [12];
  Logger local_dea0;
  undefined1 local_ced0 [12];
  Logger local_cec0;
  undefined1 local_bef0 [12];
  Logger local_bee0;
  undefined1 local_af10 [12];
  Logger local_af00;
  undefined1 local_9f30 [12];
  Logger local_9f20;
  undefined1 local_8f50 [12];
  Logger local_8f40;
  undefined1 local_7f70 [12];
  Logger local_7f60;
  undefined1 local_6f90 [12];
  Logger local_6f80;
  undefined1 local_5fb0 [12];
  Logger local_5fa0;
  undefined1 local_4fd0 [12];
  Logger local_4fc0;
  undefined1 local_3ff0 [12];
  Logger local_3fe0;
  undefined1 local_3010 [12];
  Logger local_3000;
  undefined1 local_2030 [12];
  Logger local_2020;
  undefined1 local_1040 [12];
  Logger local_1030;
  sz_ssize_t local_60;
  sz_ssize_t rst;
  void *pvStack_50;
  int recvLen;
  void *recvBuf;
  char recv [10];
  int sendLen;
  void *sendMsg;
  char *msg;
  sz_sock csock;
  sockaddr *serverSockAddr;
  InetAddress *serverAddr_local;
  Socket *sock_local;
  
  addr = sznet::net::InetAddress::getSockAddr(serverAddr);
  sock_00 = sznet::net::Socket::fd(sock);
  stack0xffffffffffffffc8 = "hello";
  sVar3 = strlen("hello");
  recv._2_4_ = (undefined4)sVar3;
  memset((void *)((long)&recvBuf + 2),0,10);
  pvStack_50 = (void *)((long)&recvBuf + 2);
  rst._4_4_ = 10;
  local_60 = 0;
  LVar2 = sznet::Logger::logLevel();
  if ((int)LVar2 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_1040,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1040._0_8_;
    file.m_size = local_1040._8_4_;
    sznet::Logger::Logger(&local_1030,file,0x36);
    pLVar4 = sznet::Logger::stream(&local_1030);
    sznet::LogStream::operator<<(pLVar4,"TEST1 BEGIN, no connect, block");
    sznet::Logger::~Logger(&local_1030);
  }
  local_60 = sznet::net::sockets::sz_udp_send(sock_00,stack0xffffffffffffffc8,recv._2_4_,addr);
  LVar2 = sznet::Logger::logLevel();
  if ((int)LVar2 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_2030,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_2030._0_8_;
    file_00.m_size = local_2030._8_4_;
    sznet::Logger::Logger(&local_2020,file_00,0x38);
    pLVar4 = sznet::Logger::stream(&local_2020);
    psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_send rst: ");
    sznet::LogStream::operator<<(psVar5,local_60);
    sznet::Logger::~Logger(&local_2020);
  }
  local_60 = sznet::net::sockets::sz_udp_recv(sock_00,pvStack_50,rst._4_4_,addr);
  if (local_60 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_3010,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_01._12_4_ = 0;
    file_01.m_data = (char *)local_3010._0_8_;
    file_01.m_size = local_3010._8_4_;
    sznet::Logger::Logger(&local_3000,file_01,0x3d,false);
    pLVar4 = sznet::Logger::stream(&local_3000);
    psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar5,local_60);
    sznet::Logger::~Logger(&local_3000);
  }
  else {
    *(undefined1 *)((long)&recvBuf + local_60 + 2) = 0;
    LVar2 = sznet::Logger::logLevel();
    if ((int)LVar2 < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_3ff0,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_02._12_4_ = 0;
      file_02.m_data = (char *)local_3ff0._0_8_;
      file_02.m_size = local_3ff0._8_4_;
      sznet::Logger::Logger(&local_3fe0,file_02,0x42);
      pLVar4 = sznet::Logger::stream(&local_3fe0);
      psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv rst: ");
      pLVar4 = sznet::LogStream::operator<<(psVar5,local_60);
      psVar5 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
      sznet::LogStream::operator<<(psVar5,(char *)((long)&recvBuf + 2));
      sznet::Logger::~Logger(&local_3fe0);
    }
  }
  LVar2 = sznet::Logger::logLevel();
  if ((int)LVar2 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_4fd0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_03._12_4_ = 0;
    file_03.m_data = (char *)local_4fd0._0_8_;
    file_03.m_size = local_4fd0._8_4_;
    sznet::Logger::Logger(&local_4fc0,file_03,0x45);
    pLVar4 = sznet::Logger::stream(&local_4fc0);
    sznet::LogStream::operator<<(pLVar4,"TEST1 END, no connect, block");
    sznet::Logger::~Logger(&local_4fc0);
  }
  LVar2 = sznet::Logger::logLevel();
  if ((int)LVar2 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_5fb0,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_04._12_4_ = 0;
    file_04.m_data = (char *)local_5fb0._0_8_;
    file_04.m_size = local_5fb0._8_4_;
    sznet::Logger::Logger(&local_5fa0,file_04,0x53);
    pLVar4 = sznet::Logger::stream(&local_5fa0);
    sznet::LogStream::operator<<(pLVar4,"TEST2 BEGIN, connect, block");
    sznet::Logger::~Logger(&local_5fa0);
  }
  sznet::net::sockets::sz_sock_connect(sock_00,addr);
  local_60 = sznet::net::sockets::sz_udp_send(sock_00,stack0xffffffffffffffc8,recv._2_4_,addr);
  if (local_60 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_6f90,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
              );
    file_05._12_4_ = 0;
    file_05.m_data = (char *)local_6f90._0_8_;
    file_05.m_size = local_6f90._8_4_;
    sznet::Logger::Logger(&local_6f80,file_05,0x59,false);
    pLVar4 = sznet::Logger::stream(&local_6f80);
    psVar5 = sznet::LogStream::operator<<(pLVar4,"first call sz_udp_recv error: ");
    sznet::LogStream::operator<<(psVar5,local_60);
    sznet::Logger::~Logger(&local_6f80);
  }
  else {
    LVar2 = sznet::Logger::logLevel();
    if ((int)LVar2 < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_7f70,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_06._12_4_ = 0;
      file_06.m_data = (char *)local_7f70._0_8_;
      file_06.m_size = local_7f70._8_4_;
      sznet::Logger::Logger(&local_7f60,file_06,0x5c);
      pLVar4 = sznet::Logger::stream(&local_7f60);
      psVar5 = sznet::LogStream::operator<<(pLVar4,"first call sz_udp_send rst: ");
      sznet::LogStream::operator<<(psVar5,local_60);
      sznet::Logger::~Logger(&local_7f60);
    }
    local_60 = sznet::net::sockets::sz_udp_send(sock_00,stack0xffffffffffffffc8,recv._2_4_,addr);
    if (local_60 < 0) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_8f50,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                );
      file_07._12_4_ = 0;
      file_07.m_data = (char *)local_8f50._0_8_;
      file_07.m_size = local_8f50._8_4_;
      sznet::Logger::Logger(&local_8f40,file_07,0x61,false);
      pLVar4 = sznet::Logger::stream(&local_8f40);
      psVar5 = sznet::LogStream::operator<<(pLVar4,"second call sz_udp_recv error: ");
      sznet::LogStream::operator<<(psVar5,local_60);
      sznet::Logger::~Logger(&local_8f40);
    }
    else {
      LVar2 = sznet::Logger::logLevel();
      if ((int)LVar2 < 3) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_9f30,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_08._12_4_ = 0;
        file_08.m_data = (char *)local_9f30._0_8_;
        file_08.m_size = local_9f30._8_4_;
        sznet::Logger::Logger(&local_9f20,file_08,100);
        pLVar4 = sznet::Logger::stream(&local_9f20);
        psVar5 = sznet::LogStream::operator<<(pLVar4,"second call sz_udp_send rst: ");
        sznet::LogStream::operator<<(psVar5,local_60);
        sznet::Logger::~Logger(&local_9f20);
      }
      local_60 = sznet::net::sockets::sz_udp_recv(sock_00,pvStack_50,rst._4_4_,addr);
      if (local_60 < 0) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_af10,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_09._12_4_ = 0;
        file_09.m_data = (char *)local_af10._0_8_;
        file_09.m_size = local_af10._8_4_;
        sznet::Logger::Logger(&local_af00,file_09,0x69,false);
        pLVar4 = sznet::Logger::stream(&local_af00);
        psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv error: ");
        sznet::LogStream::operator<<(psVar5,local_60);
        sznet::Logger::~Logger(&local_af00);
      }
      else {
        *(undefined1 *)((long)&recvBuf + local_60 + 2) = 0;
        LVar2 = sznet::Logger::logLevel();
        if ((int)LVar2 < 3) {
          sznet::Logger::SourceFile::SourceFile<115>
                    ((SourceFile *)local_bef0,
                     (char (*) [115])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                    );
          file_10._12_4_ = 0;
          file_10.m_data = (char *)local_bef0._0_8_;
          file_10.m_size = local_bef0._8_4_;
          sznet::Logger::Logger(&local_bee0,file_10,0x6e);
          pLVar4 = sznet::Logger::stream(&local_bee0);
          psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv rst: ");
          pLVar4 = sznet::LogStream::operator<<(psVar5,local_60);
          psVar5 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
          sznet::LogStream::operator<<(psVar5,(char *)((long)&recvBuf + 2));
          sznet::Logger::~Logger(&local_bee0);
        }
      }
      LVar2 = sznet::Logger::logLevel();
      if ((int)LVar2 < 3) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_ced0,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_11._12_4_ = 0;
        file_11.m_data = (char *)local_ced0._0_8_;
        file_11.m_size = local_ced0._8_4_;
        sznet::Logger::Logger(&local_cec0,file_11,0x71);
        pLVar4 = sznet::Logger::stream(&local_cec0);
        sznet::LogStream::operator<<(pLVar4,"TEST2 END, connect, block");
        sznet::Logger::~Logger(&local_cec0);
      }
      LVar2 = sznet::Logger::logLevel();
      if ((int)LVar2 < 3) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_deb0,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_12._12_4_ = 0;
        file_12.m_data = (char *)local_deb0._0_8_;
        file_12.m_size = local_deb0._8_4_;
        sznet::Logger::Logger(&local_dea0,file_12,0x7a);
        pLVar4 = sznet::Logger::stream(&local_dea0);
        sznet::LogStream::operator<<(pLVar4,"TEST3 BEGIN, connect, noblock");
        sznet::Logger::~Logger(&local_dea0);
      }
      sznet::net::sockets::sz_sock_setnonblock(sock_00,true);
      sznet::net::sockets::sz_sock_connect(sock_00,addr);
      local_60 = sznet::net::sockets::sz_udp_send(sock_00,stack0xffffffffffffffc8,recv._2_4_,addr);
      if (local_60 < 0) {
        sznet::Logger::SourceFile::SourceFile<115>
                  ((SourceFile *)local_ee90,
                   (char (*) [115])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                  );
        file_13._12_4_ = 0;
        file_13.m_data = (char *)local_ee90._0_8_;
        file_13.m_size = local_ee90._8_4_;
        sznet::Logger::Logger(&local_ee80,file_13,0x81,false);
        pLVar4 = sznet::Logger::stream(&local_ee80);
        psVar5 = sznet::LogStream::operator<<(pLVar4,"call sz_udp_recv error: ");
        sznet::LogStream::operator<<(psVar5,local_60);
        sznet::Logger::~Logger(&local_ee80);
      }
      else {
        LVar2 = sznet::Logger::logLevel();
        if ((int)LVar2 < 3) {
          sznet::Logger::SourceFile::SourceFile<115>
                    ((SourceFile *)local_fe70,
                     (char (*) [115])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                    );
          file_14._12_4_ = 0;
          file_14.m_data = (char *)local_fe70._0_8_;
          file_14.m_size = local_fe70._8_4_;
          sznet::Logger::Logger(&local_fe60,file_14,0x84);
          pLVar4 = sznet::Logger::stream(&local_fe60);
          psVar5 = sznet::LogStream::operator<<(pLVar4,"call sz_udp_send rst: ");
          sznet::LogStream::operator<<(psVar5,local_60);
          sznet::Logger::~Logger(&local_fe60);
        }
        local_60 = sznet::net::sockets::sz_udp_recv(sock_00,pvStack_50,rst._4_4_,addr);
        if (local_60 < 0) {
          bVar1 = sznet::net::sockets::sz_wouldblock();
          if (bVar1) {
            LVar2 = sznet::Logger::logLevel();
            if ((int)LVar2 < 3) {
              sznet::Logger::SourceFile::SourceFile<115>
                        ((SourceFile *)auStack_10e50,
                         (char (*) [115])
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                        );
              file_15._12_4_ = 0;
              file_15.m_data = (char *)auStack_10e50._0_8_;
              file_15.m_size = auStack_10e50._8_4_;
              sznet::Logger::Logger(&LStack_10e40,file_15,0x8b);
              pLVar4 = sznet::Logger::stream(&LStack_10e40);
              sznet::LogStream::operator<<(pLVar4,"async recv");
              sznet::Logger::~Logger(&LStack_10e40);
            }
          }
          else {
            sznet::Logger::SourceFile::SourceFile<115>
                      ((SourceFile *)auStack_11e30,
                       (char (*) [115])
                       "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                      );
            file_16._12_4_ = 0;
            file_16.m_data = (char *)auStack_11e30._0_8_;
            file_16.m_size = auStack_11e30._8_4_;
            sznet::Logger::Logger(&LStack_11e20,file_16,0x8f,false);
            pLVar4 = sznet::Logger::stream(&LStack_11e20);
            psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv error: ");
            sznet::LogStream::operator<<(psVar5,local_60);
            sznet::Logger::~Logger(&LStack_11e20);
          }
        }
        else {
          *(undefined1 *)((long)&recvBuf + local_60 + 2) = 0;
          LVar2 = sznet::Logger::logLevel();
          if ((int)LVar2 < 3) {
            sznet::Logger::SourceFile::SourceFile<115>
                      ((SourceFile *)auStack_12e10,
                       (char (*) [115])
                       "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                      );
            file_17._12_4_ = 0;
            file_17.m_data = (char *)auStack_12e10._0_8_;
            file_17.m_size = auStack_12e10._8_4_;
            sznet::Logger::Logger(&LStack_12e00,file_17,0x95);
            pLVar4 = sznet::Logger::stream(&LStack_12e00);
            psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv rst: ");
            pLVar4 = sznet::LogStream::operator<<(psVar5,local_60);
            psVar5 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
            sznet::LogStream::operator<<(psVar5,(char *)((long)&recvBuf + 2));
            sznet::Logger::~Logger(&LStack_12e00);
          }
        }
        LVar2 = sznet::Logger::logLevel();
        if ((int)LVar2 < 3) {
          sznet::Logger::SourceFile::SourceFile<115>
                    ((SourceFile *)auStack_13df0,
                     (char (*) [115])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                    );
          file_18._12_4_ = 0;
          file_18.m_data = (char *)auStack_13df0._0_8_;
          file_18.m_size = auStack_13df0._8_4_;
          sznet::Logger::Logger(&LStack_13de0,file_18,0x98);
          pLVar4 = sznet::Logger::stream(&LStack_13de0);
          sznet::LogStream::operator<<(pLVar4,"TEST2 END, connect, block");
          sznet::Logger::~Logger(&LStack_13de0);
        }
        LVar2 = sznet::Logger::logLevel();
        if ((int)LVar2 < 3) {
          sznet::Logger::SourceFile::SourceFile<115>
                    ((SourceFile *)auStack_14dd0,
                     (char (*) [115])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                    );
          file_19._12_4_ = 0;
          file_19.m_data = (char *)auStack_14dd0._0_8_;
          file_19.m_size = auStack_14dd0._8_4_;
          sznet::Logger::Logger(&LStack_14dc0,file_19,0x9e);
          pLVar4 = sznet::Logger::stream(&LStack_14dc0);
          sznet::LogStream::operator<<(pLVar4,"TEST4 BEGIN, no connect, block");
          sznet::Logger::~Logger(&LStack_14dc0);
        }
        local_60 = sznet::net::sockets::sz_udp_recv(sock_00,pvStack_50,rst._4_4_,addr);
        if (local_60 < 0) {
          sznet::Logger::SourceFile::SourceFile<115>
                    ((SourceFile *)auStack_15db0,
                     (char (*) [115])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                    );
          file_20._12_4_ = 0;
          file_20.m_data = (char *)auStack_15db0._0_8_;
          file_20.m_size = auStack_15db0._8_4_;
          sznet::Logger::Logger(&LStack_15da0,file_20,0xa3,false);
          pLVar4 = sznet::Logger::stream(&LStack_15da0);
          psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv error: ");
          sznet::LogStream::operator<<(psVar5,local_60);
          sznet::Logger::~Logger(&LStack_15da0);
        }
        else {
          *(undefined1 *)((long)&recvBuf + local_60 + 2) = 0;
          LVar2 = sznet::Logger::logLevel();
          if ((int)LVar2 < 3) {
            sznet::Logger::SourceFile::SourceFile<115>
                      ((SourceFile *)auStack_16d90,
                       (char (*) [115])
                       "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                      );
            file_21._12_4_ = 0;
            file_21.m_data = (char *)auStack_16d90._0_8_;
            file_21.m_size = auStack_16d90._8_4_;
            sznet::Logger::Logger(&LStack_16d80,file_21,0xa8);
            pLVar4 = sznet::Logger::stream(&LStack_16d80);
            psVar5 = sznet::LogStream::operator<<(pLVar4,"sz_udp_recv rst: ");
            pLVar4 = sznet::LogStream::operator<<(psVar5,local_60);
            psVar5 = sznet::LogStream::operator<<(pLVar4,", recv msg: ");
            sznet::LogStream::operator<<(psVar5,(char *)((long)&recvBuf + 2));
            sznet::Logger::~Logger(&LStack_16d80);
          }
        }
        LVar2 = sznet::Logger::logLevel();
        if ((int)LVar2 < 3) {
          sznet::Logger::SourceFile::SourceFile<115>
                    ((SourceFile *)auStack_17d70,
                     (char (*) [115])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_client.cpp"
                    );
          file_22._12_4_ = 0;
          file_22.m_data = (char *)auStack_17d70._0_8_;
          file_22.m_size = auStack_17d70._8_4_;
          sznet::Logger::Logger(&LStack_17d60,file_22,0xab);
          pLVar4 = sznet::Logger::stream(&LStack_17d60);
          sznet::LogStream::operator<<(pLVar4,"TEST4 END, no connect, block");
          sznet::Logger::~Logger(&LStack_17d60);
        }
      }
    }
  }
  return;
}

Assistant:

void HaveATest(Socket& sock, const InetAddress& serverAddr)
{
    struct sockaddr * serverSockAddr = const_cast<struct sockaddr*>(serverAddr.getSockAddr());
    sockets::sz_sock csock = sock.fd();
    const char* msg = "hello";
    const void* sendMsg = reinterpret_cast<const void*>(msg);
    int sendLen = static_cast<int>(strlen(msg));
    char recv[10] = {};
    void* recvBuf = reinterpret_cast<void*>(recv);
    int recvLen = 10;
    sz_ssize_t rst = 0;

    // ��ʹ��connect��block
    // 1.��������socket��������û�п����������£�UDPû������û�г��ַ�����Ϣ���������������ҷ���ֵ��ȷ
    // 2.��������socket�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket�������˿����������£�������û�з�����Ϣ��UDP����������Ϣ����������ʱ���ֶ��رշ����ˣ�����������
    // �����˷���Ϣ����������
    do
    {
        LOG_INFO << "TEST1 BEGIN, no connect, block";
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        LOG_INFO << "sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST1 END, no connect, block";
    } while (false);

    // UDPΪʲôҪʹ��connect��������·�ɵķ�ʱ�䣬�������Կ���
    // https://stackoverflow.com/questions/9741392/can-you-bind-and-connect-both-ends-of-a-udp-connection
    // ʹ��connect��block
    // 1.��������socket����������connect��������û�п����������£�UDPû������û�г��ַ�����Ϣ���������������ҷ���ֵ��ȷ
    // ����2�ο����ڶ����Ƿ񱨴���������û�б���
    // 2.��������socket����������connect�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket����������connect��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket����������connect�������˿����������£�������û�з�����Ϣ��UDP����������Ϣ����������ʱ���ֶ��رշ����ˣ�����������
    // �����˷���Ϣ����������
    do
    {
        LOG_INFO << "TEST2 BEGIN, connect, block";

        sockets::sz_sock_connect(csock, serverSockAddr);
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "first call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "first call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "second call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "second call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST2 END, connect, block";
    } while (false);

    // 1.���Է�����socket����������connect��������û�п����������£�����ֵ��ȷ
    // 2.��������socket����������connect�������˿����������£�UDP��������Ϣ������ֵ��ȷ
    // 3.��������socket����������connect��������û�п����������£�UDP������Ϣֱ�ӷ���-1
    // 4.��������socket����������connect�������˿����������£�������û�з�����Ϣ��UDP������������Ϣ
    do
    {
        LOG_INFO << "TEST3 BEGIN, connect, noblock";

        sockets::sz_sock_setnonblock(csock, true);
        sockets::sz_sock_connect(csock, serverSockAddr);
        rst = sockets::sz_udp_send(csock, sendMsg, sendLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "call sz_udp_recv error: " << rst;
            return;
        }
        LOG_INFO << "call sz_udp_send rst: " << rst;

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            if (sockets::sz_wouldblock())
            {
                LOG_INFO << "async recv";
            }
            else
            {
                LOG_SYSERR << "sz_udp_recv error: " << rst;
            }
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST2 END, connect, block";
    } while (false);

    // ��������û�п����������ͣ�ֱ�ӽ��գ�����-1
    do
    {
        LOG_INFO << "TEST4 BEGIN, no connect, block";

        rst = sockets::sz_udp_recv(csock, recvBuf, recvLen, serverSockAddr);
        if (rst < 0)
        {
            LOG_SYSERR << "sz_udp_recv error: " << rst;
        }
        else
        {
            recv[rst] = 0;
            LOG_INFO << "sz_udp_recv rst: " << rst << ", recv msg: " << recv;
        }

        LOG_INFO << "TEST4 END, no connect, block";
    } while (false);
}